

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O0

Lexeme * BinaryCache::GetLexems(char *path,uint *count)

{
  uint uVar1;
  uint uVar2;
  CodeDescriptor *pCVar3;
  uint local_28;
  uint i;
  uint hash;
  uint *count_local;
  char *path_local;
  
  uVar1 = NULLC::GetStringHash(path);
  local_28 = 0;
  while( true ) {
    uVar2 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::size
                      ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache);
    if (uVar2 <= local_28) {
      return (Lexeme *)0x0;
    }
    pCVar3 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache,local_28);
    if (uVar1 == pCVar3->nameHash) break;
    local_28 = local_28 + 1;
  }
  pCVar3 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                     ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache,local_28);
  *count = pCVar3->lexemeCount;
  pCVar3 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                     ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache,local_28);
  return pCVar3->lexemes;
}

Assistant:

Lexeme* BinaryCache::GetLexems(const char* path, unsigned& count)
{
	unsigned int hash = NULLC::GetStringHash(path);
	for(unsigned int i = 0; i < cache.size(); i++)
	{
		if(hash == cache[i].nameHash)
		{
			count = cache[i].lexemeCount;
			return cache[i].lexemes;
		}
	}
	return NULL;
}